

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O1

int32_t __thiscall
icu_63::TimeZoneFormat::parseOffsetFieldWithLocalizedDigits
          (TimeZoneFormat *this,UnicodeString *text,int32_t start,uint8_t minDigits,
          uint8_t maxDigits,uint16_t minVal,uint16_t maxVal,int32_t *parsedLen)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  int32_t iVar4;
  undefined7 in_register_00000009;
  int iVar5;
  undefined3 in_register_00000081;
  undefined2 in_register_0000008a;
  int iVar6;
  int32_t digitLen;
  int32_t local_44;
  int32_t local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  local_3c = CONCAT22(in_register_0000008a,minVal);
  local_38 = (uint)CONCAT71(in_register_00000009,minDigits);
  local_34 = (uint)maxVal;
  iVar5 = 0;
  *parsedLen = 0;
  local_44 = 0;
  iVar6 = 0;
  local_40 = start;
  do {
    sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar3 = (text->fUnion).fFields.fLength;
    }
    else {
      iVar3 = (int)sVar1 >> 5;
    }
    if ((iVar3 <= start) || (CONCAT31(in_register_00000081,maxDigits) <= iVar5)) break;
    iVar4 = parseSingleLocalizedDigit(this,text,start,&local_44);
    if ((iVar4 < 0) || (iVar3 = iVar4 + iVar6 * 10, (int)local_34 < iVar3)) {
      bVar2 = false;
    }
    else {
      iVar5 = iVar5 + 1;
      start = start + local_44;
      bVar2 = true;
      iVar6 = iVar3;
    }
  } while (bVar2);
  iVar4 = -1;
  if (((int)(local_38 & 0xff) <= iVar5) && ((int)(local_3c & 0xffff) <= iVar6)) {
    *parsedLen = start - local_40;
    iVar4 = iVar6;
  }
  return iVar4;
}

Assistant:

int32_t
TimeZoneFormat::parseOffsetFieldWithLocalizedDigits(const UnicodeString& text, int32_t start, uint8_t minDigits, uint8_t maxDigits, uint16_t minVal, uint16_t maxVal, int32_t& parsedLen) const {
    parsedLen = 0;

    int32_t decVal = 0;
    int32_t numDigits = 0;
    int32_t idx = start;
    int32_t digitLen = 0;

    while (idx < text.length() && numDigits < maxDigits) {
        int32_t digit = parseSingleLocalizedDigit(text, idx, digitLen);
        if (digit < 0) {
            break;
        }
        int32_t tmpVal = decVal * 10 + digit;
        if (tmpVal > maxVal) {
            break;
        }
        decVal = tmpVal;
        numDigits++;
        idx += digitLen;
    }

    // Note: maxVal is checked in the while loop
    if (numDigits < minDigits || decVal < minVal) {
        decVal = -1;
        numDigits = 0;
    } else {
        parsedLen = idx - start;
    }

    return decVal;
}